

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O2

void __thiscall nivalis::color::color::color(color *this,uint clr)

{
  color(this,clr >> 0x10 & 0xff,clr >> 8 & 0xff,clr & 0xff,0xff);
  return;
}

Assistant:

color::color(unsigned clr)
    : color((clr& 0xFF0000) >> 16,
            (clr& 0xFF00) >> 8,
            clr& 0xFF, 255){}